

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aes.c
# Opt level: O1

int mbedtls_internal_aes_encrypt(mbedtls_aes_context *ctx,uchar *input,uchar *output)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  uint *puVar4;
  uint *puVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  uint32_t X0;
  uint32_t X2;
  uint32_t X1;
  uint32_t X3;
  uint32_t Y3;
  uint32_t Y2;
  uint32_t Y1;
  uint32_t Y0;
  uint local_68;
  uint local_64;
  uint local_60;
  uint local_5c;
  uint *local_58;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uchar *local_38;
  
  puVar4 = ctx->rk;
  local_68 = *(uint *)input ^ *puVar4;
  local_60 = *(uint *)(input + 4) ^ puVar4[1];
  local_64 = *(uint *)(input + 8) ^ puVar4[2];
  puVar5 = puVar4 + 4;
  local_5c = *(uint *)(input + 0xc) ^ puVar4[3];
  iVar6 = ctx->nr >> 1;
  if (1 < iVar6) {
    iVar6 = iVar6 + 1;
    do {
      uVar10 = FT0[local_68 & 0xff] ^ *puVar5 ^ FT1[local_60 >> 8 & 0xff] ^
               *(uint *)((long)FT2 + (ulong)(local_64 >> 0xe & 0x3fc)) ^ FT3[local_5c >> 0x18];
      uVar9 = FT0[local_60 & 0xff] ^ puVar5[1] ^ FT1[local_64 >> 8 & 0xff] ^
              *(uint *)((long)FT2 + (ulong)(local_5c >> 0xe & 0x3fc)) ^ FT3[local_68 >> 0x18];
      uVar8 = FT0[local_64 & 0xff] ^ puVar5[2] ^ FT1[local_5c >> 8 & 0xff] ^
              *(uint *)((long)FT2 + (ulong)(local_68 >> 0xe & 0x3fc)) ^ FT3[local_60 >> 0x18];
      uVar7 = FT0[local_5c & 0xff] ^ puVar5[3] ^ FT1[local_68 >> 8 & 0xff] ^
              *(uint *)((long)FT2 + (ulong)(local_60 >> 0xe & 0x3fc)) ^ FT3[local_64 >> 0x18];
      local_68 = FT0[uVar10 & 0xff] ^ puVar5[4] ^ FT1[uVar9 >> 8 & 0xff] ^
                 *(uint *)((long)FT2 + (ulong)(uVar8 >> 0xe & 0x3fc)) ^ FT3[uVar7 >> 0x18];
      local_60 = FT0[uVar9 & 0xff] ^ puVar5[5] ^ FT1[uVar8 >> 8 & 0xff] ^
                 *(uint *)((long)FT2 + (ulong)(uVar7 >> 0xe & 0x3fc)) ^ FT3[uVar10 >> 0x18];
      local_64 = FT0[uVar8 & 0xff] ^ puVar5[6] ^ FT1[uVar7 >> 8 & 0xff] ^
                 *(uint *)((long)FT2 + (ulong)(uVar10 >> 0xe & 0x3fc)) ^ FT3[uVar9 >> 0x18];
      local_5c = FT0[uVar7 & 0xff] ^ puVar5[7] ^ FT1[uVar10 >> 8 & 0xff] ^
                 *(uint *)((long)FT2 + (ulong)(uVar9 >> 0xe & 0x3fc)) ^ FT3[uVar8 >> 0x18];
      puVar5 = puVar5 + 8;
      iVar6 = iVar6 + -1;
    } while (2 < iVar6);
  }
  local_44 = FT0[local_68 & 0xff] ^ *puVar5 ^ FT1[local_60 >> 8 & 0xff] ^
             *(uint *)((long)FT2 + (ulong)(local_64 >> 0xe & 0x3fc)) ^ FT3[local_5c >> 0x18];
  local_48 = FT0[local_60 & 0xff] ^ puVar5[1] ^ FT1[local_64 >> 8 & 0xff] ^
             *(uint *)((long)FT2 + (ulong)(local_5c >> 0xe & 0x3fc)) ^ FT3[local_68 >> 0x18];
  local_4c = FT0[local_64 & 0xff] ^ puVar5[2] ^ FT1[local_5c >> 8 & 0xff] ^
             *(uint *)((long)FT2 + (ulong)(local_68 >> 0xe & 0x3fc)) ^ FT3[local_60 >> 0x18];
  local_50 = FT0[local_5c & 0xff] ^ puVar5[3] ^ FT1[local_68 >> 8 & 0xff] ^
             *(uint *)((long)FT2 + (ulong)(local_60 >> 0xe & 0x3fc)) ^ FT3[local_64 >> 0x18];
  local_40 = (uint)FSb[local_44 & 0xff] ^ puVar5[4];
  local_68 = ((uint)FSb[local_50 >> 0x18] << 0x18 |
             (uint)FSb[local_4c >> 0x10 & 0xff] << 0x10 | (uint)FSb[local_48 >> 8 & 0xff] << 8) ^
             local_40;
  bVar1 = FSb[local_48 & 0xff];
  uVar7 = puVar5[5];
  local_60 = ((uint)FSb[local_44 >> 0x18] << 0x18 |
             (uint)FSb[local_50 >> 0x10 & 0xff] << 0x10 | (uint)FSb[local_4c >> 8 & 0xff] << 8) ^
             bVar1 ^ uVar7;
  bVar2 = FSb[local_4c & 0xff];
  uVar8 = puVar5[6];
  local_58 = puVar5 + 8;
  local_64 = ((uint)FSb[local_48 >> 0x18] << 0x18 |
             (uint)FSb[local_44 >> 0x10 & 0xff] << 0x10 | (uint)FSb[local_50 >> 8 & 0xff] << 8) ^
             bVar2 ^ uVar8;
  bVar3 = FSb[local_50 & 0xff];
  uVar9 = puVar5[7];
  local_5c = ((uint)FSb[local_4c >> 0x18] << 0x18 |
             (uint)FSb[local_48 >> 0x10 & 0xff] << 0x10 | (uint)FSb[local_44 >> 8 & 0xff] << 8) ^
             bVar3 ^ uVar9;
  *output = (uchar)local_40;
  output[1] = (uchar)(local_68 >> 8);
  output[2] = (uchar)(local_68 >> 0x10);
  output[3] = (uchar)(local_68 >> 0x18);
  output[4] = (uchar)(bVar1 ^ uVar7);
  output[5] = (uchar)(local_60 >> 8);
  output[6] = (uchar)(local_60 >> 0x10);
  output[7] = (uchar)(local_60 >> 0x18);
  output[8] = (uchar)(bVar2 ^ uVar8);
  output[9] = (uchar)(local_64 >> 8);
  output[10] = (uchar)(local_64 >> 0x10);
  output[0xb] = (uchar)(local_64 >> 0x18);
  output[0xc] = (uchar)(bVar3 ^ uVar9);
  output[0xd] = (uchar)(local_5c >> 8);
  output[0xe] = (uchar)(local_5c >> 0x10);
  output[0xf] = (uchar)(local_5c >> 0x18);
  local_3c = local_68;
  local_38 = output;
  mbedtls_platform_zeroize(&local_68,4);
  mbedtls_platform_zeroize(&local_60,4);
  mbedtls_platform_zeroize(&local_64,4);
  mbedtls_platform_zeroize(&local_5c,4);
  mbedtls_platform_zeroize(&local_44,4);
  mbedtls_platform_zeroize(&local_48,4);
  mbedtls_platform_zeroize(&local_4c,4);
  mbedtls_platform_zeroize(&local_50,4);
  mbedtls_platform_zeroize(&local_58,8);
  return 0;
}

Assistant:

int mbedtls_internal_aes_encrypt( mbedtls_aes_context *ctx,
                                  const unsigned char input[16],
                                  unsigned char output[16] )
{
    int i;
    uint32_t *RK, X0, X1, X2, X3, Y0, Y1, Y2, Y3;

    RK = ctx->rk;

    GET_UINT32_LE( X0, input,  0 ); X0 ^= *RK++;
    GET_UINT32_LE( X1, input,  4 ); X1 ^= *RK++;
    GET_UINT32_LE( X2, input,  8 ); X2 ^= *RK++;
    GET_UINT32_LE( X3, input, 12 ); X3 ^= *RK++;

    for( i = ( ctx->nr >> 1 ) - 1; i > 0; i-- )
    {
        AES_FROUND( Y0, Y1, Y2, Y3, X0, X1, X2, X3 );
        AES_FROUND( X0, X1, X2, X3, Y0, Y1, Y2, Y3 );
    }

    AES_FROUND( Y0, Y1, Y2, Y3, X0, X1, X2, X3 );

    X0 = *RK++ ^ \
            ( (uint32_t) FSb[ ( Y0       ) & 0xFF ]       ) ^
            ( (uint32_t) FSb[ ( Y1 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) FSb[ ( Y2 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) FSb[ ( Y3 >> 24 ) & 0xFF ] << 24 );

    X1 = *RK++ ^ \
            ( (uint32_t) FSb[ ( Y1       ) & 0xFF ]       ) ^
            ( (uint32_t) FSb[ ( Y2 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) FSb[ ( Y3 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) FSb[ ( Y0 >> 24 ) & 0xFF ] << 24 );

    X2 = *RK++ ^ \
            ( (uint32_t) FSb[ ( Y2       ) & 0xFF ]       ) ^
            ( (uint32_t) FSb[ ( Y3 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) FSb[ ( Y0 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) FSb[ ( Y1 >> 24 ) & 0xFF ] << 24 );

    X3 = *RK++ ^ \
            ( (uint32_t) FSb[ ( Y3       ) & 0xFF ]       ) ^
            ( (uint32_t) FSb[ ( Y0 >>  8 ) & 0xFF ] <<  8 ) ^
            ( (uint32_t) FSb[ ( Y1 >> 16 ) & 0xFF ] << 16 ) ^
            ( (uint32_t) FSb[ ( Y2 >> 24 ) & 0xFF ] << 24 );

    PUT_UINT32_LE( X0, output,  0 );
    PUT_UINT32_LE( X1, output,  4 );
    PUT_UINT32_LE( X2, output,  8 );
    PUT_UINT32_LE( X3, output, 12 );

    mbedtls_platform_zeroize( &X0, sizeof( X0 ) );
    mbedtls_platform_zeroize( &X1, sizeof( X1 ) );
    mbedtls_platform_zeroize( &X2, sizeof( X2 ) );
    mbedtls_platform_zeroize( &X3, sizeof( X3 ) );

    mbedtls_platform_zeroize( &Y0, sizeof( Y0 ) );
    mbedtls_platform_zeroize( &Y1, sizeof( Y1 ) );
    mbedtls_platform_zeroize( &Y2, sizeof( Y2 ) );
    mbedtls_platform_zeroize( &Y3, sizeof( Y3 ) );

    mbedtls_platform_zeroize( &RK, sizeof( RK ) );

    return( 0 );
}